

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLHOMINGPIGEON_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000218;
  double *in_stack_00000220;
  double *in_stack_00000228;
  double *in_stack_00000230;
  int in_stack_0000023c;
  int in_stack_00000240;
  int *in_stack_00000250;
  int *in_stack_00000258;
  int *in_stack_00000260;
  
  TVar1 = TA_CDLHOMINGPIGEON(in_stack_00000240,in_stack_0000023c,in_stack_00000230,in_stack_00000228
                             ,in_stack_00000220,in_stack_00000218,in_stack_00000250,
                             in_stack_00000258,in_stack_00000260);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLHOMINGPIGEON_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLHOMINGPIGEON(
/* Generated */                         startIdx,
/* Generated */                         endIdx,
/* Generated */                         params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                         params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                         params->in[0].data.inPrice.low, /* inLow */
/* Generated */                         params->in[0].data.inPrice.close, /* inClose */
/* Generated */                         outBegIdx, 
/* Generated */                         outNBElement, 
/* Generated */                         params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }